

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_rbtree.c
# Opt level: O1

void ngx_rbtree_delete(ngx_rbtree_t *tree,ngx_rbtree_node_t *node)

{
  u_char uVar1;
  ngx_rbtree_node_t *pnVar2;
  ngx_rbtree_node_t *pnVar3;
  ngx_rbtree_node_t *pnVar4;
  ngx_rbtree_node_t *pnVar5;
  ngx_rbtree_t *pnVar6;
  ngx_rbtree_node_t *temp_1;
  ngx_rbtree_t *pnVar7;
  ngx_rbtree_node_t *pnVar8;
  bool bVar9;
  
  pnVar2 = tree->sentinel;
  pnVar5 = node->right;
  pnVar3 = node;
  if ((node->left != pnVar2) &&
     (bVar9 = pnVar5 != pnVar2, pnVar4 = pnVar5, pnVar5 = node->left, bVar9)) {
    do {
      pnVar3 = pnVar4;
      pnVar4 = pnVar3->left;
    } while (pnVar3->left != pnVar2);
    pnVar5 = pnVar3->right;
  }
  if (pnVar3 == tree->root) {
    tree->root = pnVar5;
    pnVar5->color = '\0';
    node->right = (ngx_rbtree_node_t *)0x0;
    node->parent = (ngx_rbtree_node_t *)0x0;
    node->key = 0;
    node->left = (ngx_rbtree_node_t *)0x0;
    return;
  }
  pnVar4 = pnVar3->parent;
  uVar1 = pnVar3->color;
  (&pnVar4->left)[pnVar3 != pnVar4->left] = pnVar5;
  pnVar8 = pnVar5;
  if (pnVar3 != node) {
    if (pnVar4 == node) {
      pnVar4 = pnVar3;
    }
    pnVar5->parent = pnVar4;
    pnVar3->left = node->left;
    pnVar3->right = node->right;
    pnVar3->parent = node->parent;
    pnVar3->color = node->color;
    pnVar6 = tree;
    if (tree->root != node) {
      pnVar4 = node->parent;
      pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
      if (pnVar4->left == node) {
        pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
      }
    }
    pnVar6->root = pnVar3;
    if (pnVar3->left != pnVar2) {
      pnVar3->left->parent = pnVar3;
    }
    pnVar4 = pnVar3;
    pnVar8 = pnVar3->right;
    if (pnVar3->right == pnVar2) goto LAB_0011d895;
  }
  pnVar8->parent = pnVar4;
LAB_0011d895:
  node->right = (ngx_rbtree_node_t *)0x0;
  node->parent = (ngx_rbtree_node_t *)0x0;
  node->key = 0;
  node->left = (ngx_rbtree_node_t *)0x0;
  if (uVar1 == '\0') {
    if (pnVar5 != tree->root) {
      do {
        if (pnVar5->color != '\0') break;
        pnVar6 = (ngx_rbtree_t *)&pnVar5->parent;
        pnVar3 = pnVar5->parent;
        pnVar4 = pnVar3->left;
        if (pnVar5 == pnVar4) {
          pnVar4 = pnVar3->right;
          if (pnVar4->color != '\0') {
            pnVar4->color = '\0';
            pnVar3->color = '\x01';
            pnVar5 = pnVar4->left;
            pnVar3->right = pnVar5;
            if (pnVar5 != pnVar2) {
              pnVar5->parent = pnVar3;
            }
            pnVar4->parent = pnVar3->parent;
            pnVar7 = tree;
            if (tree->root != pnVar3) {
              pnVar5 = pnVar3->parent;
              pnVar7 = (ngx_rbtree_t *)&pnVar5->right;
              if (pnVar5->left == pnVar3) {
                pnVar7 = (ngx_rbtree_t *)&pnVar5->left;
              }
            }
            pnVar7->root = pnVar4;
            pnVar4->left = pnVar3;
            pnVar3->parent = pnVar4;
            pnVar4 = (*(ngx_rbtree_node_t **)pnVar6)->right;
          }
          pnVar5 = pnVar4->left;
          if ((pnVar5->color != '\0') || (pnVar4->right->color != '\0')) {
            if (pnVar4->right->color == '\0') {
              pnVar5->color = '\0';
              pnVar4->color = '\x01';
              pnVar3 = pnVar5->right;
              pnVar4->left = pnVar3;
              if (pnVar3 != pnVar2) {
                pnVar3->parent = pnVar4;
              }
              pnVar5->parent = pnVar4->parent;
              pnVar7 = tree;
              if (tree->root != pnVar4) {
                pnVar3 = pnVar4->parent;
                pnVar7 = (ngx_rbtree_t *)&pnVar3->left;
                if (pnVar3->right == pnVar4) {
                  pnVar7 = (ngx_rbtree_t *)&pnVar3->right;
                }
              }
              pnVar7->root = pnVar5;
              pnVar5->right = pnVar4;
              pnVar4->parent = pnVar5;
              pnVar4 = (*(ngx_rbtree_node_t **)pnVar6)->right;
            }
            pnVar5 = *(ngx_rbtree_node_t **)pnVar6;
            pnVar4->color = pnVar5->color;
            pnVar5->color = '\0';
            pnVar4->right->color = '\0';
            pnVar3 = pnVar5->right;
            pnVar4 = pnVar3->left;
            pnVar5->right = pnVar4;
            if (pnVar4 != pnVar2) {
              pnVar4->parent = pnVar5;
            }
            pnVar3->parent = pnVar5->parent;
            pnVar6 = tree;
            if (tree->root != pnVar5) {
              pnVar4 = pnVar5->parent;
              pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
              if (pnVar4->left == pnVar5) {
                pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
              }
            }
            pnVar6->root = pnVar3;
            pnVar3->left = pnVar5;
            goto LAB_0011dab7;
          }
LAB_0011db39:
          pnVar4->color = '\x01';
        }
        else {
          if (pnVar4->color != '\0') {
            pnVar4->color = '\0';
            pnVar3->color = '\x01';
            pnVar5 = pnVar4->right;
            pnVar3->left = pnVar5;
            if (pnVar5 != pnVar2) {
              pnVar5->parent = pnVar3;
            }
            pnVar4->parent = pnVar3->parent;
            pnVar7 = tree;
            if (tree->root != pnVar3) {
              pnVar5 = pnVar3->parent;
              pnVar7 = (ngx_rbtree_t *)&pnVar5->left;
              if (pnVar5->right == pnVar3) {
                pnVar7 = (ngx_rbtree_t *)&pnVar5->right;
              }
            }
            pnVar7->root = pnVar4;
            pnVar4->right = pnVar3;
            pnVar3->parent = pnVar4;
            pnVar4 = (*(ngx_rbtree_node_t **)pnVar6)->left;
          }
          if (pnVar4->left->color == '\0') {
            if (pnVar4->right->color == '\0') goto LAB_0011db39;
            pnVar5 = pnVar4->right;
            pnVar5->color = '\0';
            pnVar4->color = '\x01';
            pnVar3 = pnVar5->left;
            pnVar4->right = pnVar3;
            if (pnVar3 != pnVar2) {
              pnVar3->parent = pnVar4;
            }
            pnVar5->parent = pnVar4->parent;
            pnVar7 = tree;
            if (tree->root != pnVar4) {
              pnVar3 = pnVar4->parent;
              pnVar7 = (ngx_rbtree_t *)&pnVar3->right;
              if (pnVar3->left == pnVar4) {
                pnVar7 = (ngx_rbtree_t *)&pnVar3->left;
              }
            }
            pnVar7->root = pnVar5;
            pnVar5->left = pnVar4;
            pnVar4->parent = pnVar5;
            pnVar4 = (*(ngx_rbtree_node_t **)pnVar6)->left;
          }
          pnVar5 = *(ngx_rbtree_node_t **)pnVar6;
          pnVar4->color = pnVar5->color;
          pnVar5->color = '\0';
          pnVar4->left->color = '\0';
          pnVar3 = pnVar5->left;
          pnVar4 = pnVar3->right;
          pnVar5->left = pnVar4;
          if (pnVar4 != pnVar2) {
            pnVar4->parent = pnVar5;
          }
          pnVar3->parent = pnVar5->parent;
          pnVar6 = tree;
          if (tree->root != pnVar5) {
            pnVar4 = pnVar5->parent;
            pnVar6 = (ngx_rbtree_t *)&pnVar4->left;
            if (pnVar4->right == pnVar5) {
              pnVar6 = (ngx_rbtree_t *)&pnVar4->right;
            }
          }
          pnVar6->root = pnVar3;
          pnVar3->right = pnVar5;
LAB_0011dab7:
          pnVar5->parent = pnVar3;
          pnVar6 = tree;
        }
        pnVar5 = pnVar6->root;
      } while (pnVar5 != tree->root);
    }
    pnVar5->color = '\0';
  }
  return;
}

Assistant:

void
ngx_rbtree_delete(ngx_rbtree_t *tree, ngx_rbtree_node_t *node)
{
    ngx_uint_t           red;
    ngx_rbtree_node_t  **root, *sentinel, *subst, *temp, *w;

    /* a binary tree delete */

    root = &tree->root;
    sentinel = tree->sentinel;

    if (node->left == sentinel) {
        temp = node->right;
        subst = node;

    } else if (node->right == sentinel) {
        temp = node->left;
        subst = node;

    } else {
        subst = ngx_rbtree_min(node->right, sentinel);

        if (subst->left != sentinel) {
            temp = subst->left;
        } else {
            temp = subst->right;
        }
    }

    if (subst == *root) {
        *root = temp;
        ngx_rbt_black(temp);

        /* DEBUG stuff */
        node->left = NULL;
        node->right = NULL;
        node->parent = NULL;
        node->key = 0;

        return;
    }

    red = ngx_rbt_is_red(subst);

    if (subst == subst->parent->left) {
        subst->parent->left = temp;

    } else {
        subst->parent->right = temp;
    }

    if (subst == node) {

        temp->parent = subst->parent;

    } else {

        if (subst->parent == node) {
            temp->parent = subst;

        } else {
            temp->parent = subst->parent;
        }

        subst->left = node->left;
        subst->right = node->right;
        subst->parent = node->parent;
        ngx_rbt_copy_color(subst, node);

        if (node == *root) {
            *root = subst;

        } else {
            if (node == node->parent->left) {
                node->parent->left = subst;
            } else {
                node->parent->right = subst;
            }
        }

        if (subst->left != sentinel) {
            subst->left->parent = subst;
        }

        if (subst->right != sentinel) {
            subst->right->parent = subst;
        }
    }

    /* DEBUG stuff */
    node->left = NULL;
    node->right = NULL;
    node->parent = NULL;
    node->key = 0;

    if (red) {
        return;
    }

    /* a delete fixup */

    while (temp != *root && ngx_rbt_is_black(temp)) {

        if (temp == temp->parent->left) {
            w = temp->parent->right;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                w = temp->parent->right;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->right)) {
                    ngx_rbt_black(w->left);
                    ngx_rbt_red(w);
                    ngx_rbtree_right_rotate(root, sentinel, w);
                    w = temp->parent->right;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->right);
                ngx_rbtree_left_rotate(root, sentinel, temp->parent);
                temp = *root;
            }

        } else {
            w = temp->parent->left;

            if (ngx_rbt_is_red(w)) {
                ngx_rbt_black(w);
                ngx_rbt_red(temp->parent);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                w = temp->parent->left;
            }

            if (ngx_rbt_is_black(w->left) && ngx_rbt_is_black(w->right)) {
                ngx_rbt_red(w);
                temp = temp->parent;

            } else {
                if (ngx_rbt_is_black(w->left)) {
                    ngx_rbt_black(w->right);
                    ngx_rbt_red(w);
                    ngx_rbtree_left_rotate(root, sentinel, w);
                    w = temp->parent->left;
                }

                ngx_rbt_copy_color(w, temp->parent);
                ngx_rbt_black(temp->parent);
                ngx_rbt_black(w->left);
                ngx_rbtree_right_rotate(root, sentinel, temp->parent);
                temp = *root;
            }
        }
    }

    ngx_rbt_black(temp);
}